

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDupDfs(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pFanin;
  uint uVar1;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  else {
    if ((pNtk->ntkType | ABC_NTK_LOGIC) == ABC_NTK_STRASH) {
      __assert_fail("!Abc_NtkIsStrash(pNtk) && !Abc_NtkIsNetlist(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0x1eb,"Abc_Ntk_t *Abc_NtkDupDfs(Abc_Ntk_t *)");
    }
    pNtk_00 = Abc_NtkStartFrom(pNtk,pNtk->ntkType,pNtk->ntkFunc);
    p = Abc_NtkDfs(pNtk,0);
    for (iVar5 = 0; iVar5 < p->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar5);
      Abc_NtkDupObj(pNtk_00,pAVar2,0);
    }
    Vec_PtrFree(p);
    for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = Abc_NtkObj(pNtk,iVar5);
      if ((((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xe) != 8)) &&
          (uVar1 = *(uint *)&pAVar2->field_0x14 & 0xf, uVar1 != 5)) && (uVar1 != 10)) {
        for (lVar6 = 0; lVar6 < (pAVar2->vFanins).nSize; lVar6 = lVar6 + 1) {
          if (((pAVar2->field_6).pCopy != (Abc_Obj_t *)0x0) &&
             (pFanin = *(Abc_Obj_t **)
                        ((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar6]] + 0x40),
             pFanin != (Abc_Obj_t *)0x0)) {
            Abc_ObjAddFanin((pAVar2->field_6).pCopy,pFanin);
          }
        }
      }
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar3 = Abc_NtkDup(pNtk->pExdc);
      pNtk_00->pExdc = pAVar3;
    }
    if ((Abc_Ntk_t *)pNtk->pExcare != (Abc_Ntk_t *)0x0) {
      pAVar3 = Abc_NtkDup((Abc_Ntk_t *)pNtk->pExcare);
      pNtk_00->pExcare = pAVar3;
    }
    if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
      Abc_NtkTimeInitialize(pNtk_00,pNtk);
    }
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      Abc_NtkTransferPhases(pNtk_00,pNtk);
    }
    if (pNtk->pWLoadUsed != (char *)0x0) {
      pcVar4 = Abc_UtilStrsav(pNtk->pWLoadUsed);
      pNtk_00->pWLoadUsed = pcVar4;
    }
    iVar5 = Abc_NtkCheck(pNtk_00);
    if (iVar5 == 0) {
      fwrite("Abc_NtkDup(): Network check has failed.\n",0x28,1,_stdout);
    }
    pNtk->pCopy = pNtk_00;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkDupDfs( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    if ( pNtk == NULL )
        return NULL;
    assert( !Abc_NtkIsStrash(pNtk) && !Abc_NtkIsNetlist(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, pNtk->ntkType, pNtk->ntkFunc );
    // copy the internal nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Vec_PtrFree( vNodes );
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( pObj->pCopy && pFanin->pCopy )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( pNtk->pExcare )
        pNtkNew->pExcare = Abc_NtkDup( (Abc_Ntk_t *)pNtk->pExcare );
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
    // check correctness
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    pNtk->pCopy = pNtkNew;
    return pNtkNew;
}